

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

size_t __thiscall PSymbolTable::MarkSymbols(PSymbolTable *this)

{
  bool bVar1;
  Pair *local_30;
  Pair *pair;
  Iterator it;
  size_t count;
  PSymbolTable *this_local;
  
  it.Position = 0;
  it._12_4_ = 0;
  TMapIterator<FName,_PSymbol_*,_TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>_>
  ::TMapIterator((TMapIterator<FName,_PSymbol_*,_TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>_>
                  *)&pair,&this->Symbols);
  while( true ) {
    bVar1 = TMapIterator<FName,_PSymbol_*,_TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>_>
            ::NextPair((TMapIterator<FName,_PSymbol_*,_TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>_>
                        *)&pair,&local_30);
    if (!bVar1) break;
    GC::Mark<PSymbol>(&local_30->Value);
    it._8_8_ = it._8_8_ + 1;
  }
  return it._8_8_ << 4;
}

Assistant:

size_t PSymbolTable::MarkSymbols()
{
	size_t count = 0;
	MapType::Iterator it(Symbols);
	MapType::Pair *pair;

	while (it.NextPair(pair))
	{
		GC::Mark(pair->Value);
		count++;
	}
	return count * sizeof(*pair);
}